

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O0

void h2_pri_spec(Curl_easy *data,nghttp2_priority_spec *pri_spec)

{
  int32_t local_34;
  HTTP *local_30;
  int32_t depstream_id;
  HTTP *depstream;
  nghttp2_priority_spec *pri_spec_local;
  Curl_easy *data_local;
  
  if ((data->set).stream_depends_on == (Curl_easy *)0x0) {
    local_30 = (HTTP *)0x0;
  }
  else {
    local_30 = (((data->set).stream_depends_on)->req).p.http;
  }
  if (local_30 == (HTTP *)0x0) {
    local_34 = 0;
  }
  else {
    local_34 = local_30->stream_id;
  }
  nghttp2_priority_spec_init
            (pri_spec,local_34,(data->set).stream_weight,
             (uint)((ulong)*(undefined8 *)&(data->set).field_0x8e2 >> 0x2d) & 1);
  (data->state).stream_weight = (data->set).stream_weight;
  *(uint *)&(data->state).field_0x6d0 =
       *(uint *)&(data->state).field_0x6d0 & 0xffffefff |
       ((uint)((ulong)*(undefined8 *)&(data->set).field_0x8e2 >> 0x2d) & 1) << 0xc;
  (data->state).stream_depends_on = (data->set).stream_depends_on;
  return;
}

Assistant:

static void h2_pri_spec(struct Curl_easy *data,
                        nghttp2_priority_spec *pri_spec)
{
  struct HTTP *depstream = (data->set.stream_depends_on?
                            data->set.stream_depends_on->req.p.http:NULL);
  int32_t depstream_id = depstream? depstream->stream_id:0;
  nghttp2_priority_spec_init(pri_spec, depstream_id, data->set.stream_weight,
                             data->set.stream_depends_e);
  data->state.stream_weight = data->set.stream_weight;
  data->state.stream_depends_e = data->set.stream_depends_e;
  data->state.stream_depends_on = data->set.stream_depends_on;
}